

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

void __thiscall myEmployee::ArchiveOUT(myEmployee *this,ChArchiveOut *marchive)

{
  myEnum_mapper enum_map;
  myEnum_mapper local_80;
  ChEnumMapper<myEnum> local_60;
  char *local_40;
  ChEnumMapper<myEnum> *local_38;
  undefined1 local_30;
  
  chrono::ChArchiveOut::VersionWrite<myEmployee>(marchive);
  local_80.super_ChEnumMapper<myEnum>.value_ptr = (myEnum *)&this->age;
  local_80.super_ChEnumMapper<myEnum>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x1409ef;
  local_80.super_ChEnumMapper<myEnum>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_80);
  local_80.super_ChEnumMapper<myEnum>.value_ptr = (myEnum *)&this->wages;
  local_80.super_ChEnumMapper<myEnum>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x14092c;
  local_80.super_ChEnumMapper<myEnum>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  myEnum_mapper::myEnum_mapper(&local_80);
  myEnum_mapper::operator()(&local_60,&local_80,&this->body);
  local_40 = "body";
  local_30 = 0;
  local_38 = &local_60;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00158460
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<myEnum>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)&PTR_GetValueAsInt_00158460;
  if (local_80.super_ChEnumMapper<myEnum>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<myEnum>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployee>();
        // stream out all member data
        marchive << CHNVP(age);
        marchive << CHNVP(wages);
        myEnum_mapper enum_map;
        marchive << CHNVP(enum_map(body), "body"); // note: CHNVP macro can override names used when streaming to ascii..
    }